

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O2

void * SSC32InterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  if ((szSSC32InterfacePath[0] == ':') && (iVar3 = atoi(szSSC32InterfacePath + 1), 0 < iVar3)) {
    SSC32InterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv(szSSC32InterfacePath + 1,handlessc32interfacecli,(void *)0x0);
      if (iVar3 == 0) goto LAB_0015fd97;
      puts("Error launching the SSC32Interface server.");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar3 = handlessc32interface(&SSC32InterfacePseudoRS232Port);
        if (iVar3 == 0) goto LAB_0015fd7c;
        puts("Connection to a SSC32Interface lost.");
        disconnectssc32interface(&SSC32InterfacePseudoRS232Port);
        uSleep(50000);
LAB_0015fd6e:
        bVar1 = false;
        bVar2 = true;
      }
      else {
        iVar3 = connectssc32interface(&SSC32InterfacePseudoRS232Port);
        if (iVar3 != 0) {
          mSleep(1000);
          goto LAB_0015fd6e;
        }
        uSleep(50000);
LAB_0015fd7c:
        bVar2 = false;
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      disconnectssc32interface(&SSC32InterfacePseudoRS232Port);
LAB_0015fd97:
      if (bExit == 0) {
        bExit = 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SSC32InterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(ssc32interfacefilename, LOG_FOLDER"ssc32interface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//ssc32interfacefile = fopen(ssc32interfacefilename, "w");
	//if (ssc32interfacefile == NULL)
	//{
	//	printf("Unable to create ssc32interface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szSSC32InterfacePath[0] == ':')&&(atoi(szSSC32InterfacePath+1) > 0))
	{
		SSC32InterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szSSC32InterfacePath+1, handlessc32interfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the SSC32Interface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*50);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("SSC32InterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectssc32interface(&SSC32InterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*50);
					bConnected = TRUE; 

					inithandlessc32interface(&SSC32InterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlessc32interface(&SSC32InterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32Interface lost.\n");
					bConnected = FALSE;
					disconnectssc32interface(&SSC32InterfacePseudoRS232Port);
					uSleep(1000*50);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectssc32interface(&SSC32InterfacePseudoRS232Port);
	}

	//fclose(ssc32interfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}